

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GdlGlyphClassDefn.cpp
# Opt level: O2

GdlGlyphClassMember * __thiscall
GdlGlyphClassDefn::AddGlyphToClass
          (GdlGlyphClassDefn *this,GrpLineAndFile *lnf,GlyphType glft,int nFirst)

{
  GdlGlyphDefn *this_00;
  
  this_00 = (GdlGlyphDefn *)operator_new(0xb0);
  GdlGlyphDefn::GdlGlyphDefn(this_00,glft,nFirst);
  GrpLineAndFile::operator=
            (&(this_00->super_GdlGlyphClassMember).super_GdlDefn.super_GdlObject.m_lnf,lnf);
  AddMember(this,(GdlGlyphClassMember *)this_00,lnf);
  return &this_00->super_GdlGlyphClassMember;
}

Assistant:

GdlGlyphClassMember * GdlGlyphClassDefn::AddGlyphToClass(GrpLineAndFile const& lnf,
	GlyphType glft, int nFirst)
{
	GdlGlyphDefn * pglf = new GdlGlyphDefn(glft, nFirst);
	pglf->SetLineAndFile(lnf);
	AddMember(pglf, lnf);
	return pglf;
}